

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O2

void __thiscall
cmExtraEclipseCDT4Generator::CreateSourceProjectFile(cmExtraEclipseCDT4Generator *this)

{
  string *__lhs;
  bool bVar1;
  ostream *poVar2;
  string filename;
  string name;
  cmGeneratedFileStream fout;
  allocator local_2c2;
  allocator local_2c1;
  string local_2c0;
  string local_2a0;
  string local_280;
  cmGeneratedFileStream local_260;
  
  __lhs = &this->HomeDirectory;
  bVar1 = std::operator!=(__lhs,&this->HomeOutputDirectory);
  if (bVar1) {
    std::__cxx11::string::string
              ((string *)&local_260,
               ((*(((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->
                  LocalGenerators).
                  super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                  _M_impl.super__Vector_impl_data._M_start)->Makefile->ProjectName)._M_dataplus._M_p
               ,&local_2c1);
    std::__cxx11::string::string((string *)&local_2a0,"Source",&local_2c2);
    GetPathBasename(&local_2c0,__lhs);
    GenerateProjectName(&local_280,(string *)&local_260,&local_2a0,&local_2c0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_260);
    std::operator+(&local_2a0,__lhs,"/.project");
    cmGeneratedFileStream::cmGeneratedFileStream(&local_260,local_2a0._M_dataplus._M_p,false);
    if (((&local_260.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
         [*(long *)((long)local_260.super_ofstream.
                          super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream +
                   -0x18)] & 5) == 0) {
      poVar2 = std::operator<<((ostream *)&local_260,
                               "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<projectDescription>\n\t<name>"
                              );
      EscapeForXML(&local_2c0,&local_280);
      poVar2 = std::operator<<(poVar2,(string *)&local_2c0);
      std::operator<<(poVar2,
                      "</name>\n\t<comment></comment>\n\t<projects>\n\t</projects>\n\t<buildSpec>\n\t</buildSpec>\n\t<natures>\n\t</natures>\n\t<linkedResources>\n"
                     );
      std::__cxx11::string::~string((string *)&local_2c0);
      if (this->SupportsVirtualFolders == true) {
        CreateLinksToSubprojects(this,&local_260,__lhs);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(&this->SrcLinkedResources);
      }
      std::operator<<((ostream *)&local_260,"\t</linkedResources>\n</projectDescription>\n");
    }
    cmGeneratedFileStream::~cmGeneratedFileStream(&local_260);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_280);
    return;
  }
  __assert_fail("this->HomeDirectory != this->HomeOutputDirectory",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmExtraEclipseCDT4Generator.cxx"
                ,0x9d,"void cmExtraEclipseCDT4Generator::CreateSourceProjectFile()");
}

Assistant:

void cmExtraEclipseCDT4Generator::CreateSourceProjectFile()
{
  assert(this->HomeDirectory != this->HomeOutputDirectory);

  // set up the project name: <project>-Source@<baseSourcePathName>
  const cmMakefile* mf
     = this->GlobalGenerator->GetLocalGenerators()[0]->GetMakefile();
  std::string name = this->GenerateProjectName(mf->GetProjectName(), "Source",
                                   this->GetPathBasename(this->HomeDirectory));

  const std::string filename = this->HomeDirectory + "/.project";
  cmGeneratedFileStream fout(filename.c_str());
  if (!fout)
    {
    return;
    }

  fout <<
    "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
    "<projectDescription>\n"
    "\t<name>" << this->EscapeForXML(name) << "</name>\n"
    "\t<comment></comment>\n"
    "\t<projects>\n"
    "\t</projects>\n"
    "\t<buildSpec>\n"
    "\t</buildSpec>\n"
    "\t<natures>\n"
    "\t</natures>\n"
    "\t<linkedResources>\n";

  if (this->SupportsVirtualFolders)
    {
    this->CreateLinksToSubprojects(fout, this->HomeDirectory);
    this->SrcLinkedResources.clear();
    }

  fout <<
    "\t</linkedResources>\n"
    "</projectDescription>\n"
    ;
}